

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_mail_client.c
# Opt level: O1

int write_and_get_response(mbedtls_net_context *sock_fd,uchar *buf,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *__format;
  ulong uVar4;
  char code [4];
  char local_ac [124];
  ulong uStack_30;
  
  printf("\n%s");
  if ((len == 0) || (uVar1 = mbedtls_net_send(sock_fd,buf,len), 0 < (int)uVar1)) {
    local_ac[0x74] = '\0';
    local_ac[0x75] = '\0';
    local_ac[0x76] = '\0';
    local_ac[0x77] = '\0';
    local_ac[0x78] = '\0';
    local_ac[0x79] = '\0';
    local_ac[0x7a] = '\0';
    local_ac[0x7b] = '\0';
    uStack_30 = 0;
    local_ac[100] = '\0';
    local_ac[0x65] = '\0';
    local_ac[0x66] = '\0';
    local_ac[0x67] = '\0';
    local_ac[0x68] = '\0';
    local_ac[0x69] = '\0';
    local_ac[0x6a] = '\0';
    local_ac[0x6b] = '\0';
    local_ac[0x6c] = '\0';
    local_ac[0x6d] = '\0';
    local_ac[0x6e] = '\0';
    local_ac[0x6f] = '\0';
    local_ac[0x70] = '\0';
    local_ac[0x71] = '\0';
    local_ac[0x72] = '\0';
    local_ac[0x73] = '\0';
    local_ac[0x54] = '\0';
    local_ac[0x55] = '\0';
    local_ac[0x56] = '\0';
    local_ac[0x57] = '\0';
    local_ac[0x58] = '\0';
    local_ac[0x59] = '\0';
    local_ac[0x5a] = '\0';
    local_ac[0x5b] = '\0';
    local_ac[0x5c] = '\0';
    local_ac[0x5d] = '\0';
    local_ac[0x5e] = '\0';
    local_ac[0x5f] = '\0';
    local_ac[0x60] = '\0';
    local_ac[0x61] = '\0';
    local_ac[0x62] = '\0';
    local_ac[99] = '\0';
    local_ac[0x44] = '\0';
    local_ac[0x45] = '\0';
    local_ac[0x46] = '\0';
    local_ac[0x47] = '\0';
    local_ac[0x48] = '\0';
    local_ac[0x49] = '\0';
    local_ac[0x4a] = '\0';
    local_ac[0x4b] = '\0';
    local_ac[0x4c] = '\0';
    local_ac[0x4d] = '\0';
    local_ac[0x4e] = '\0';
    local_ac[0x4f] = '\0';
    local_ac[0x50] = '\0';
    local_ac[0x51] = '\0';
    local_ac[0x52] = '\0';
    local_ac[0x53] = '\0';
    local_ac[0x34] = '\0';
    local_ac[0x35] = '\0';
    local_ac[0x36] = '\0';
    local_ac[0x37] = '\0';
    local_ac[0x38] = '\0';
    local_ac[0x39] = '\0';
    local_ac[0x3a] = '\0';
    local_ac[0x3b] = '\0';
    local_ac[0x3c] = '\0';
    local_ac[0x3d] = '\0';
    local_ac[0x3e] = '\0';
    local_ac[0x3f] = '\0';
    local_ac[0x40] = '\0';
    local_ac[0x41] = '\0';
    local_ac[0x42] = '\0';
    local_ac[0x43] = '\0';
    local_ac[0x24] = '\0';
    local_ac[0x25] = '\0';
    local_ac[0x26] = '\0';
    local_ac[0x27] = '\0';
    local_ac[0x28] = '\0';
    local_ac[0x29] = '\0';
    local_ac[0x2a] = '\0';
    local_ac[0x2b] = '\0';
    local_ac[0x2c] = '\0';
    local_ac[0x2d] = '\0';
    local_ac[0x2e] = '\0';
    local_ac[0x2f] = '\0';
    local_ac[0x30] = '\0';
    local_ac[0x31] = '\0';
    local_ac[0x32] = '\0';
    local_ac[0x33] = '\0';
    local_ac[0x14] = '\0';
    local_ac[0x15] = '\0';
    local_ac[0x16] = '\0';
    local_ac[0x17] = '\0';
    local_ac[0x18] = '\0';
    local_ac[0x19] = '\0';
    local_ac[0x1a] = '\0';
    local_ac[0x1b] = '\0';
    local_ac[0x1c] = '\0';
    local_ac[0x1d] = '\0';
    local_ac[0x1e] = '\0';
    local_ac[0x1f] = '\0';
    local_ac[0x20] = '\0';
    local_ac[0x21] = '\0';
    local_ac[0x22] = '\0';
    local_ac[0x23] = '\0';
    local_ac[4] = '\0';
    local_ac[5] = '\0';
    local_ac[6] = '\0';
    local_ac[7] = '\0';
    local_ac[8] = '\0';
    local_ac[9] = '\0';
    local_ac[10] = '\0';
    local_ac[0xb] = '\0';
    local_ac[0xc] = '\0';
    local_ac[0xd] = '\0';
    local_ac[0xe] = '\0';
    local_ac[0xf] = '\0';
    local_ac[0x10] = '\0';
    local_ac[0x11] = '\0';
    local_ac[0x12] = '\0';
    local_ac[0x13] = '\0';
    uVar1 = mbedtls_net_recv(sock_fd,(uchar *)(local_ac + 4),0x7f);
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        uStack_30 = uStack_30 & 0xffffffffffffff;
        printf("\n%s",local_ac + 4);
        uVar3 = 0;
        do {
          if (local_ac[uVar3 + 4] == '\n') {
            if ((uVar4 == 4) && ((byte)(local_ac[0] - 0x30U) < 10)) {
              uVar4 = 0;
              if (local_ac[3] == ' ') {
                local_ac[3] = 0;
                iVar2 = atoi(local_ac);
                return iVar2;
              }
            }
            else {
              uVar4 = 0;
            }
          }
          else if (uVar4 < 4) {
            local_ac[uVar4] = local_ac[uVar3 + 4];
            uVar4 = uVar4 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 + (uVar1 == 0) != uVar3);
        local_ac[0x74] = '\0';
        local_ac[0x75] = '\0';
        local_ac[0x76] = '\0';
        local_ac[0x77] = '\0';
        local_ac[0x78] = '\0';
        local_ac[0x79] = '\0';
        local_ac[0x7a] = '\0';
        local_ac[0x7b] = '\0';
        uStack_30 = 0;
        local_ac[100] = '\0';
        local_ac[0x65] = '\0';
        local_ac[0x66] = '\0';
        local_ac[0x67] = '\0';
        local_ac[0x68] = '\0';
        local_ac[0x69] = '\0';
        local_ac[0x6a] = '\0';
        local_ac[0x6b] = '\0';
        local_ac[0x6c] = '\0';
        local_ac[0x6d] = '\0';
        local_ac[0x6e] = '\0';
        local_ac[0x6f] = '\0';
        local_ac[0x70] = '\0';
        local_ac[0x71] = '\0';
        local_ac[0x72] = '\0';
        local_ac[0x73] = '\0';
        local_ac[0x54] = '\0';
        local_ac[0x55] = '\0';
        local_ac[0x56] = '\0';
        local_ac[0x57] = '\0';
        local_ac[0x58] = '\0';
        local_ac[0x59] = '\0';
        local_ac[0x5a] = '\0';
        local_ac[0x5b] = '\0';
        local_ac[0x5c] = '\0';
        local_ac[0x5d] = '\0';
        local_ac[0x5e] = '\0';
        local_ac[0x5f] = '\0';
        local_ac[0x60] = '\0';
        local_ac[0x61] = '\0';
        local_ac[0x62] = '\0';
        local_ac[99] = '\0';
        local_ac[0x44] = '\0';
        local_ac[0x45] = '\0';
        local_ac[0x46] = '\0';
        local_ac[0x47] = '\0';
        local_ac[0x48] = '\0';
        local_ac[0x49] = '\0';
        local_ac[0x4a] = '\0';
        local_ac[0x4b] = '\0';
        local_ac[0x4c] = '\0';
        local_ac[0x4d] = '\0';
        local_ac[0x4e] = '\0';
        local_ac[0x4f] = '\0';
        local_ac[0x50] = '\0';
        local_ac[0x51] = '\0';
        local_ac[0x52] = '\0';
        local_ac[0x53] = '\0';
        local_ac[0x34] = '\0';
        local_ac[0x35] = '\0';
        local_ac[0x36] = '\0';
        local_ac[0x37] = '\0';
        local_ac[0x38] = '\0';
        local_ac[0x39] = '\0';
        local_ac[0x3a] = '\0';
        local_ac[0x3b] = '\0';
        local_ac[0x3c] = '\0';
        local_ac[0x3d] = '\0';
        local_ac[0x3e] = '\0';
        local_ac[0x3f] = '\0';
        local_ac[0x40] = '\0';
        local_ac[0x41] = '\0';
        local_ac[0x42] = '\0';
        local_ac[0x43] = '\0';
        local_ac[0x24] = '\0';
        local_ac[0x25] = '\0';
        local_ac[0x26] = '\0';
        local_ac[0x27] = '\0';
        local_ac[0x28] = '\0';
        local_ac[0x29] = '\0';
        local_ac[0x2a] = '\0';
        local_ac[0x2b] = '\0';
        local_ac[0x2c] = '\0';
        local_ac[0x2d] = '\0';
        local_ac[0x2e] = '\0';
        local_ac[0x2f] = '\0';
        local_ac[0x30] = '\0';
        local_ac[0x31] = '\0';
        local_ac[0x32] = '\0';
        local_ac[0x33] = '\0';
        local_ac[0x14] = '\0';
        local_ac[0x15] = '\0';
        local_ac[0x16] = '\0';
        local_ac[0x17] = '\0';
        local_ac[0x18] = '\0';
        local_ac[0x19] = '\0';
        local_ac[0x1a] = '\0';
        local_ac[0x1b] = '\0';
        local_ac[0x1c] = '\0';
        local_ac[0x1d] = '\0';
        local_ac[0x1e] = '\0';
        local_ac[0x1f] = '\0';
        local_ac[0x20] = '\0';
        local_ac[0x21] = '\0';
        local_ac[0x22] = '\0';
        local_ac[0x23] = '\0';
        local_ac[4] = '\0';
        local_ac[5] = '\0';
        local_ac[6] = '\0';
        local_ac[7] = '\0';
        local_ac[8] = '\0';
        local_ac[9] = '\0';
        local_ac[10] = '\0';
        local_ac[0xb] = '\0';
        local_ac[0xc] = '\0';
        local_ac[0xd] = '\0';
        local_ac[0xe] = '\0';
        local_ac[0xf] = '\0';
        local_ac[0x10] = '\0';
        local_ac[0x11] = '\0';
        local_ac[0x12] = '\0';
        local_ac[0x13] = '\0';
        uVar1 = mbedtls_net_recv(sock_fd,(uchar *)(local_ac + 4),0x7f);
      } while (0 < (int)uVar1);
    }
    __format = "failed\n  ! read returned %d\n\n";
  }
  else {
    __format = " failed\n  ! mbedtls_ssl_write returned %d\n\n";
  }
  printf(__format,(ulong)uVar1);
  return -1;
}

Assistant:

static int write_and_get_response( mbedtls_net_context *sock_fd, unsigned char *buf, size_t len )
{
    int ret;
    unsigned char data[128];
    char code[4];
    size_t i, idx = 0;

    mbedtls_printf("\n%s", buf);
    if( len && ( ret = mbedtls_net_send( sock_fd, buf, len ) ) <= 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ssl_write returned %d\n\n", ret );
            return -1;
    }

    do
    {
        len = sizeof( data ) - 1;
        memset( data, 0, sizeof( data ) );
        ret = mbedtls_net_recv( sock_fd, data, len );

        if( ret <= 0 )
        {
            mbedtls_printf( "failed\n  ! read returned %d\n\n", ret );
            return -1;
        }

        data[len] = '\0';
        mbedtls_printf("\n%s", data);
        len = ret;
        for( i = 0; i < len; i++ )
        {
            if( data[i] != '\n' )
            {
                if( idx < 4 )
                    code[ idx++ ] = data[i];
                continue;
            }

            if( idx == 4 && code[0] >= '0' && code[0] <= '9' && code[3] == ' ' )
            {
                code[3] = '\0';
                return atoi( code );
            }

            idx = 0;
        }
    }
    while( 1 );
}